

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qtooltip.cpp
# Opt level: O2

void __thiscall QTipLabel::timerEvent(QTipLabel *this,QTimerEvent *e)

{
  if ((*(TimerId *)(e + 0x10) != (this->hideTimer).m_id) &&
     (*(TimerId *)(e + 0x10) != (this->expireTimer).m_id)) {
    return;
  }
  QBasicTimer::stop();
  QBasicTimer::stop();
  hideTipImmediately(this);
  return;
}

Assistant:

void QTipLabel::timerEvent(QTimerEvent *e)
{
    if (e->timerId() == hideTimer.timerId()
        || e->timerId() == expireTimer.timerId()){
        hideTimer.stop();
        expireTimer.stop();
        hideTipImmediately();
    }
}